

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

bool amrex::AmrLevel::isStateVariable(string *name,int *typ,int *n)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  StateDescriptor *this;
  string *__lhs;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  while( true ) {
    *typ = iVar5;
    iVar2 = DescriptorList::size((DescriptorList *)desc_lst);
    if (iVar2 <= iVar5) break;
    this = DescriptorList::operator[]((DescriptorList *)desc_lst,*typ);
    iVar4 = 0;
    while( true ) {
      *n = iVar4;
      iVar3 = StateDescriptor::nComp(this);
      if (iVar3 <= iVar4) break;
      __lhs = StateDescriptor::name_abi_cxx11_(this,*n);
      _Var1 = std::operator==(__lhs,name);
      if (_Var1) goto LAB_005700ed;
      iVar4 = *n + 1;
    }
    iVar5 = *typ + 1;
  }
LAB_005700ed:
  return iVar5 < iVar2;
}

Assistant:

bool
AmrLevel::isStateVariable (const std::string& name, int& typ, int& n)
{
    for (typ = 0; typ < desc_lst.size(); typ++)
    {
        const StateDescriptor& desc = desc_lst[typ];

        for (n = 0; n < desc.nComp(); n++)
        {
            if (desc.name(n) == name)
                return true;
        }
    }
    return false;
}